

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcssparser.cpp
# Opt level: O0

void parseShorthandBackgroundProperty
               (QList<QCss::Value> *values,BrushData *brush,QString *image,Repeat *repeat,
               Alignment *alignment,QPalette *pal)

{
  long lVar1;
  QFlagsStorage<Qt::AlignmentFlag> QVar2;
  int iVar3;
  Int IVar4;
  QBrush *this;
  qsizetype qVar5;
  const_reference values_00;
  quint64 qVar6;
  const_reference pVVar7;
  enum_type *in_RCX;
  QList<QCss::Value> *in_RDI;
  QFlagsStorage<Qt::AlignmentFlag> *in_R8;
  long in_FS_OFFSET;
  int count;
  int start;
  Repeat repeatAttempt;
  Value *v;
  int i;
  Alignment a;
  QPalette *in_stack_000000b0;
  Value *in_stack_000000b8;
  BrushData *in_stack_fffffffffffffee8;
  enum_type in_stack_fffffffffffffef0;
  enum_type in_stack_fffffffffffffef4;
  undefined4 in_stack_ffffffffffffff00;
  int in_stack_ffffffffffffff04;
  int in_stack_ffffffffffffff08;
  enum_type in_stack_ffffffffffffff0c;
  int local_e4;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  QCss::BrushData::BrushData
            ((BrushData *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0));
  QCss::BrushData::operator=
            ((BrushData *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffee8);
  QCss::BrushData::~BrushData((BrushData *)0xa323f2);
  QString::QString((QString *)0xa323ff);
  QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     (QString *)in_stack_fffffffffffffee8);
  QString::~QString((QString *)0xa3241e);
  *in_RCX = AlignHCenter;
  QVar2.i = (Int)Qt::operator|(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
  in_R8->i = QVar2.i;
  local_e4 = 0;
  do {
    this = (QBrush *)(long)local_e4;
    qVar5 = QList<QCss::Value>::size(in_RDI);
    if (qVar5 <= (long)this) {
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
        return;
      }
      __stack_chk_fail();
    }
    values_00 = QList<QCss::Value>::at
                          ((QList<QCss::Value> *)
                           CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                           (qsizetype)in_stack_fffffffffffffee8);
    if (values_00->type == Uri) {
      QVariant::toString();
      QString::operator=((QString *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                         (QString *)in_stack_fffffffffffffee8);
      QString::~QString((QString *)0xa324dc);
    }
    else {
      if (values_00->type == KnownIdentifier) {
        iVar3 = QVariant::toInt((bool *)&values_00->variant);
        if (iVar3 == 0x27) {
          QString::QString((QString *)0xa3250f);
          QString::operator=((QString *)
                             CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                             (QString *)in_stack_fffffffffffffee8);
          QString::~QString((QString *)0xa3252e);
          goto LAB_00a32709;
        }
      }
      if (values_00->type == KnownIdentifier) {
        iVar3 = QVariant::toInt((bool *)&values_00->variant);
        if (iVar3 == 0x28) {
          QBrush::QBrush(this,in_stack_fffffffffffffef4,in_stack_fffffffffffffef0);
          QCss::BrushData::BrushData
                    ((BrushData *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     &in_stack_fffffffffffffee8->brush);
          QCss::BrushData::operator=
                    ((BrushData *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                     in_stack_fffffffffffffee8);
          QCss::BrushData::~BrushData((BrushData *)0xa3259f);
          QBrush::~QBrush((QBrush *)0xa325ac);
        }
      }
      iVar3 = (int)((ulong)this >> 0x20);
      QVariant::toString();
      qVar6 = findKnownValue((QString *)
                             CONCAT44(in_stack_ffffffffffffff0c,in_stack_ffffffffffffff08),
                             (QCssKnownValue *)
                             CONCAT44(in_stack_ffffffffffffff04,in_stack_ffffffffffffff00),iVar3);
      in_stack_fffffffffffffef4 = (enum_type)qVar6;
      QString::~QString((QString *)0xa325f0);
      in_stack_ffffffffffffff0c = in_stack_fffffffffffffef4;
      if (in_stack_fffffffffffffef4 == 0) {
        if (values_00->type == KnownIdentifier) {
          in_stack_ffffffffffffff04 = 1;
          in_stack_fffffffffffffee8 = (BrushData *)(long)local_e4;
          in_stack_ffffffffffffff08 = local_e4;
          qVar5 = QList<QCss::Value>::size(in_RDI);
          if ((long)in_stack_fffffffffffffee8 < qVar5 + -1) {
            pVVar7 = QList<QCss::Value>::at
                               ((QList<QCss::Value> *)
                                CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                                (qsizetype)in_stack_fffffffffffffee8);
            if (pVVar7->type == KnownIdentifier) {
              local_e4 = local_e4 + 1;
              in_stack_ffffffffffffff04 = in_stack_ffffffffffffff04 + 1;
            }
          }
          iVar3 = -0x55555556;
          QList<QCss::Value>::constData((QList<QCss::Value> *)0xa32693);
          QVar2.i = (Int)parseAlignment(values_00,iVar3);
          IVar4 = QFlags::operator_cast_to_unsigned_int((QFlags *)&stack0xffffffffffffff64);
          if (IVar4 != 0) {
            in_R8->i = QVar2.i;
            goto LAB_00a32709;
          }
          local_e4 = local_e4 - (in_stack_ffffffffffffff04 + -1);
        }
        parseBrushValue(in_stack_000000b8,in_stack_000000b0);
        QCss::BrushData::operator=
                  ((BrushData *)CONCAT44(in_stack_fffffffffffffef4,in_stack_fffffffffffffef0),
                   in_stack_fffffffffffffee8);
        QCss::BrushData::~BrushData((BrushData *)0xa32709);
      }
      else {
        *in_RCX = in_stack_fffffffffffffef4;
      }
    }
LAB_00a32709:
    local_e4 = local_e4 + 1;
  } while( true );
}

Assistant:

static void parseShorthandBackgroundProperty(const QList<QCss::Value> &values, BrushData *brush, QString *image, Repeat *repeat, Qt::Alignment *alignment, const QPalette &pal)
{
    *brush = BrushData();
    *image = QString();
    *repeat = Repeat_XY;
    *alignment = Qt::AlignTop | Qt::AlignLeft;

    for (int i = 0; i < values.size(); ++i) {
        const QCss::Value &v = values.at(i);
        if (v.type == Value::Uri) {
            *image = v.variant.toString();
            continue;
        } else if (v.type == Value::KnownIdentifier && v.variant.toInt() == Value_None) {
            *image = QString();
            continue;
        } else if (v.type == Value::KnownIdentifier && v.variant.toInt() == Value_Transparent) {
            *brush = QBrush(Qt::transparent);
        }

        Repeat repeatAttempt = static_cast<Repeat>(findKnownValue(v.variant.toString(),
                                                   repeats, NumKnownRepeats));
        if (repeatAttempt != Repeat_Unknown) {
            *repeat = repeatAttempt;
            continue;
        }

        if (v.type == Value::KnownIdentifier) {
            const int start = i;
            int count = 1;
            if (i < values.size() - 1
                && values.at(i + 1).type == Value::KnownIdentifier) {
                ++i;
                ++count;
            }
            Qt::Alignment a = parseAlignment(values.constData() + start, count);
            if (int(a) != 0) {
                *alignment = a;
                continue;
            }
            i -= count - 1;
        }

        *brush = parseBrushValue(v, pal);
    }
}